

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O3

int luaD_precall(lua_State *L,StkId func,int nresults)

{
  lua_CFunction *pp_Var1;
  byte bVar2;
  lua_CFunction p_Var3;
  uint uVar4;
  int iVar5;
  TValue *pTVar6;
  CallInfo *pCVar7;
  StkId pTVar8;
  long lVar9;
  StkId pTVar10;
  uint uVar11;
  long lVar12;
  long lVar13;
  
  uVar4 = func->tt_;
  while( true ) {
    pTVar10 = L->stack;
    uVar4 = uVar4 & 0x3f;
    if (uVar4 == 6) {
      lVar12 = *(long *)((func->value_).f + 0x18);
      pTVar8 = L->top;
      if ((long)L->stack_last - (long)pTVar8 >> 4 <= (long)(ulong)*(byte *)(lVar12 + 0x7a)) {
        luaD_growstack(L,(uint)*(byte *)(lVar12 + 0x7a));
      }
      bVar2 = *(byte *)(lVar12 + 0x78);
      uVar4 = (uint)bVar2;
      iVar5 = (int)((ulong)((long)pTVar8 - (long)func) >> 4);
      if ((int)(uint)bVar2 < iVar5) {
        uVar11 = iVar5 - 1;
      }
      else {
        pTVar8 = L->top;
        iVar5 = (uVar4 - iVar5) + 1;
        do {
          pTVar8->tt_ = 0;
          pTVar8 = pTVar8 + 1;
          iVar5 = iVar5 + -1;
        } while (iVar5 != 0);
        L->top = pTVar8;
        uVar11 = uVar4;
      }
      lVar13 = (long)func - (long)pTVar10;
      if (*(char *)(lVar12 + 0x79) == '\0') {
        pTVar8 = L->stack;
        pTVar10 = (StkId)((long)pTVar8 + lVar13 + 0x10);
      }
      else {
        pTVar10 = L->top;
        if ((long)L->stack_last - (long)pTVar10 >> 4 <= (long)(ulong)*(byte *)(lVar12 + 0x7a)) {
          luaD_growstack(L,(uint)*(byte *)(lVar12 + 0x7a));
          pTVar10 = L->top;
        }
        if (uVar4 != 0) {
          lVar9 = 0;
          do {
            pTVar8 = L->top;
            L->top = pTVar8 + 1;
            pTVar8->value_ = *(Value *)((long)&pTVar10[-(ulong)uVar11].value_ + lVar9);
            pTVar8->tt_ = *(int *)((long)&pTVar10[-(ulong)uVar11].tt_ + lVar9);
            *(undefined4 *)((long)&pTVar10[-(ulong)uVar11].tt_ + lVar9) = 0;
            lVar9 = lVar9 + 0x10;
          } while ((ulong)bVar2 << 4 != lVar9);
        }
        pTVar8 = L->stack;
      }
      pCVar7 = L->ci->next;
      if (pCVar7 == (CallInfo *)0x0) {
        pCVar7 = luaE_extendCI(L);
      }
      L->ci = pCVar7;
      pCVar7->nresults = (short)nresults;
      pCVar7->func = (StkId)(lVar13 + (long)pTVar8);
      (pCVar7->u).l.base = pTVar10;
      bVar2 = *(byte *)(lVar12 + 0x7a);
      pCVar7->top = pTVar10 + bVar2;
      (pCVar7->u).l.savedpc = *(Instruction **)(lVar12 + 0x18);
      pCVar7->callstatus = '\x01';
      L->top = pTVar10 + bVar2;
      if (0 < L->l_G->GCdebt) {
        luaC_step(L);
      }
      if ((L->hookmask & 1) != 0) {
        pp_Var1 = &(pCVar7->u).c.k;
        *pp_Var1 = *pp_Var1 + 4;
        iVar5 = 0;
        if (((pCVar7->previous->callstatus & 1) != 0) &&
           ((*(uint *)((pCVar7->previous->u).c.k + -4) & 0x3f) == 0x1e)) {
          pCVar7->callstatus = pCVar7->callstatus | 0x40;
          iVar5 = 4;
        }
        luaD_hook(L,iVar5,-1);
        pp_Var1 = &(pCVar7->u).c.k;
        *pp_Var1 = *pp_Var1 + -4;
      }
      return 0;
    }
    pTVar6 = func;
    if (uVar4 == 0x16) break;
    if (uVar4 == 0x26) {
      pTVar6 = (TValue *)((func->value_).f + 0x18);
      break;
    }
    pTVar6 = luaT_gettmbyobj(L,func,TM_CALL);
    if ((pTVar6->tt_ & 0xfU) != 6) {
      luaG_typeerror(L,func,"call");
    }
    pTVar8 = L->stack;
    pTVar10 = L->top;
    if (func < pTVar10) {
      do {
        pTVar10->value_ = pTVar10[-1].value_;
        pTVar10->tt_ = pTVar10[-1].tt_;
        pTVar10 = pTVar10 + -1;
      } while (func < pTVar10);
      pTVar10 = L->top;
    }
    L->top = pTVar10 + 1;
    if ((long)L->stack_last - (long)(pTVar10 + 1) < 0x10) {
      luaD_growstack(L,0);
    }
    lVar12 = (long)func - (long)pTVar8;
    pTVar10 = L->stack;
    *(Value *)((long)pTVar10 + lVar12) = pTVar6->value_;
    uVar4 = pTVar6->tt_;
    *(uint *)((long)pTVar10 + lVar12 + 8) = uVar4;
    func = (StkId)(lVar12 + (long)pTVar10);
  }
  p_Var3 = (pTVar6->value_).f;
  if ((long)L->stack_last - (long)L->top < 0x150) {
    luaD_growstack(L,0x14);
  }
  pCVar7 = L->ci->next;
  if (pCVar7 == (CallInfo *)0x0) {
    pCVar7 = luaE_extendCI(L);
  }
  L->ci = pCVar7;
  pCVar7->nresults = (short)nresults;
  pCVar7->func = (StkId)(((long)func - (long)pTVar10) + (long)L->stack);
  pCVar7->top = L->top + 0x14;
  pCVar7->callstatus = '\0';
  if (0 < L->l_G->GCdebt) {
    luaC_step(L);
  }
  if ((L->hookmask & 1) != 0) {
    luaD_hook(L,0,-1);
  }
  iVar5 = (*p_Var3)(L);
  luaD_poscall(L,L->top + -(long)iVar5);
  return 1;
}

Assistant:

int luaD_precall (lua_State *L, StkId func, int nresults) {
  lua_CFunction f;
  CallInfo *ci;
  int n;  /* number of arguments (Lua) or returns (C) */
  ptrdiff_t funcr = savestack(L, func);
  switch (ttype(func)) {
    case LUA_TLCF:  /* light C function */
      f = fvalue(func);
      goto Cfunc;
    case LUA_TCCL: {  /* C closure */
      f = clCvalue(func)->f;
     Cfunc:
      luaD_checkstack(L, LUA_MINSTACK);  /* ensure minimum stack size */
      ci = next_ci(L);  /* now 'enter' new function */
      ci->nresults = nresults;
      ci->func = restorestack(L, funcr);
      ci->top = L->top + LUA_MINSTACK;
      lua_assert(ci->top <= L->stack_last);
      ci->callstatus = 0;
      luaC_checkGC(L);  /* stack grow uses memory */
      if (L->hookmask & LUA_MASKCALL)
        luaD_hook(L, LUA_HOOKCALL, -1);
      lua_unlock(L);
      n = (*f)(L);  /* do the actual call */
      lua_lock(L);
      api_checknelems(L, n);
      luaD_poscall(L, L->top - n);
      return 1;
    }
    case LUA_TLCL: {  /* Lua function: prepare its call */
      StkId base;
      Proto *p = clLvalue(func)->p;
      n = cast_int(L->top - func) - 1;  /* number of real arguments */
      luaD_checkstack(L, p->maxstacksize);
      for (; n < p->numparams; n++)
        setnilvalue(L->top++);  /* complete missing arguments */
      if (!p->is_vararg) {
        func = restorestack(L, funcr);
        base = func + 1;
      }
      else {
        base = adjust_varargs(L, p, n);
        func = restorestack(L, funcr);  /* previous call can change stack */
      }
      ci = next_ci(L);  /* now 'enter' new function */
      ci->nresults = nresults;
      ci->func = func;
      ci->u.l.base = base;
      ci->top = base + p->maxstacksize;
      lua_assert(ci->top <= L->stack_last);
      ci->u.l.savedpc = p->code;  /* starting point */
      ci->callstatus = CIST_LUA;
      L->top = ci->top;
      luaC_checkGC(L);  /* stack grow uses memory */
      if (L->hookmask & LUA_MASKCALL)
        callhook(L, ci);
      return 0;
    }
    default: {  /* not a function */
      func = tryfuncTM(L, func);  /* retry with 'function' tag method */
      return luaD_precall(L, func, nresults);  /* now it must be a function */
    }
  }
}